

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfparse.c
# Opt level: O0

int parser_key(sf_parser *sfp,sf_vec *dest)

{
  uint8_t *puVar1;
  int iVar2;
  long *in_RSI;
  sf_parser *in_RDI;
  uint8_t *base;
  int local_4;
  
  if ((*in_RDI->pos == 0x2a) || (*in_RDI->pos - 0x61 < 0x1a)) {
    puVar1 = in_RDI->pos;
    in_RDI->pos = puVar1 + 1;
    while (iVar2 = parser_eof(in_RDI), iVar2 == 0) {
      switch(*in_RDI->pos) {
      case '*':
      case '-':
      case '.':
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
      case '_':
      case 'a':
      case 'b':
      case 'c':
      case 'd':
      case 'e':
      case 'f':
      case 'g':
      case 'h':
      case 'i':
      case 'j':
      case 'k':
      case 'l':
      case 'm':
      case 'n':
      case 'o':
      case 'p':
      case 'q':
      case 'r':
      case 's':
      case 't':
      case 'u':
      case 'v':
      case 'w':
      case 'x':
      case 'y':
      case 'z':
        in_RDI->pos = in_RDI->pos + 1;
        break;
      default:
        goto LAB_00128fc4;
      }
    }
LAB_00128fc4:
    if (in_RSI != (long *)0x0) {
      *in_RSI = (long)puVar1;
      in_RSI[1] = (long)in_RDI->pos - *in_RSI;
    }
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int parser_key(sf_parser *sfp, sf_vec *dest) {
  const uint8_t *base;

  switch (*sfp->pos) {
  case '*':
  LCALPHA_CASES:
    break;
  default:
    return SF_ERR_PARSE_ERROR;
  }

  base = sfp->pos++;

  for (; !parser_eof(sfp); ++sfp->pos) {
    switch (*sfp->pos) {
    case '_':
    case '-':
    case '.':
    case '*':
    DIGIT_CASES:
    LCALPHA_CASES:
      continue;
    }

    break;
  }

  if (dest) {
    dest->base = (uint8_t *)base;
    dest->len = (size_t)(sfp->pos - dest->base);
  }

  return 0;
}